

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall ccs::ParserImpl::parseRule(ParserImpl *this,Nested *ast)

{
  Location LVar1;
  bool bVar2;
  string *psVar3;
  Nested *local_1c0;
  _Head_base<0UL,_ccs::ast::AstRule_*,_false> local_1b8;
  string local_1b0 [32];
  ostringstream _message;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188 [46];
  
  bVar2 = parsePrimRule(this,ast);
  if (bVar2) {
    advanceIf(this,SEMI);
    return;
  }
  std::make_unique<ccs::ast::Nested>();
  parseSelector((ParserImpl *)&_message);
  std::__shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(local_1c0->selector_).
              super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2> *)&_message);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_188);
  bVar2 = advanceIf(this,COLON);
  if (bVar2) {
    bVar2 = parsePrimRule(this,local_1c0);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&_message);
      std::operator<<((ostream *)&_message,"Expected @import, @constrain, or property setting");
      psVar3 = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LVar1 = (this->cur_).location;
      std::__cxx11::string::string(psVar3,local_1b0);
      *(Location *)(psVar3 + 0x20) = LVar1;
      __cxa_throw(psVar3,&(anonymous_namespace)::parse_error::typeinfo,
                  anon_unknown_0::parse_error::~parse_error);
    }
    advanceIf(this,SEMI);
  }
  else {
    bVar2 = advanceIf(this,LBRACE);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&_message);
      std::operator<<((ostream *)&_message,"Expected \':\' or \'{\' following selector");
      psVar3 = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LVar1 = (this->cur_).location;
      std::__cxx11::string::string(psVar3,local_1b0);
      *(Location *)(psVar3 + 0x20) = LVar1;
      __cxa_throw(psVar3,&(anonymous_namespace)::parse_error::typeinfo,
                  anon_unknown_0::parse_error::~parse_error);
    }
    while (bVar2 = advanceIf(this,RBRACE), !bVar2) {
      parseRule(this,local_1c0);
    }
  }
  local_1b8._M_head_impl = &local_1c0->super_AstRule;
  std::
  vector<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>,std::allocator<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>>>
  ::emplace_back<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>>
            ((vector<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>,std::allocator<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>>>
              *)&ast->rules_,
             (unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_> *)&local_1b8);
  if ((Nested *)local_1b8._M_head_impl != (Nested *)0x0) {
    (*((AstRule *)&(local_1b8._M_head_impl)->_vptr_AstRule)->_vptr_AstRule[1])();
  }
  return;
}

Assistant:

void parseRule(ast::Nested &ast) {
    // the only ambiguity is between ident as start of a property setting
    // and ident as start of a selector, i.e.:
    //   foo = bar
    //   foo : bar = 'baz'
    // we can use the presence of '=' to disambiguate. parsePrimRule() performs
    // this lookahead without consuming the additional token.
    if (parsePrimRule(ast)) {
      advanceIf(Token::SEMI);
      return;
    }

    auto nested = std::make_unique<ast::Nested>();
    nested->selector_ = parseSelector();

    if (advanceIf(Token::COLON)) {
      if (!parsePrimRule(*nested))
        THROW(cur_.location,
            "Expected @import, @constrain, or property setting");
      advanceIf(Token::SEMI);
    } else if (advanceIf(Token::LBRACE)) {
      while (!advanceIf(Token::RBRACE)) parseRule(*nested);
    } else {
      THROW(cur_.location, "Expected ':' or '{' following selector");
    }

    ast.addRule(std::move(nested));
  }